

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O0

void __thiscall CTcSymObj::mark_compiled_as_class(CTcSymObj *this)

{
  CTcDataStream *in_RDI;
  CTcDataStream *str;
  uint flags;
  ulong in_stack_ffffffffffffffd8;
  
  CTcSymObjBase::get_stream((CTcSymObjBase *)0x2252f8);
  CTPNStmObject::get_stream_obj_flags(in_RDI,in_stack_ffffffffffffffd8);
  CTPNStmObject::set_stream_obj_flags(in_RDI,in_stack_ffffffffffffffd8,0);
  return;
}

Assistant:

void CTcSymObj::mark_compiled_as_class()
{
    uint flags;
    CTcDataStream *str;

    /* get the appropriate stream for generating the data */
    str = get_stream();
    
    /* get my original object flags */
    flags = CTPNStmObject::get_stream_obj_flags(str, stream_ofs_);

    /* add in the 'class' flag */
    flags |= TCT3_OBJFLG_CLASS;

    /* set the updated flags */
    CTPNStmObject::set_stream_obj_flags(str, stream_ofs_, flags);
}